

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

SharedCameraModel __thiscall ary::CameraUser::getCameraModel(CameraUser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  SharedCameraModel SVar2;
  SharedCameraModel SVar3;
  
  in_RDI->_vptr_CameraModel =
       (_func_int **)
       (this->camera).super_shared_ptr<ary::CameraModel>.
       super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->camera).super_shared_ptr<ary::CameraModel>.
           super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI->intrinsics).val = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      SVar2.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      SVar2.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SharedCameraModel)
             SVar2.super_shared_ptr<ary::CameraModel>.
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  SVar3.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar3.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedCameraModel)
         SVar3.super_shared_ptr<ary::CameraModel>.
         super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedCameraModel CameraUser::getCameraModel() {
	return camera;
}